

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O1

char * pstrcat(char *buf,int buf_size,char *s)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  
  sVar2 = strlen(buf);
  iVar1 = (int)sVar2;
  uVar6 = buf_size - iVar1;
  if ((uVar6 != 0 && iVar1 <= buf_size) && (uVar6 != 0 && iVar1 <= buf_size)) {
    pcVar3 = buf + iVar1;
    cVar4 = *s;
    if ((cVar4 != '\0') && (pcVar5 = pcVar3 + ((ulong)uVar6 - 1), pcVar3 < pcVar5)) {
      pcVar7 = s + 1;
      do {
        *pcVar3 = cVar4;
        pcVar3 = pcVar3 + 1;
        cVar4 = *pcVar7;
        if (cVar4 == '\0') break;
        pcVar7 = pcVar7 + 1;
      } while (pcVar3 < pcVar5);
    }
    *pcVar3 = '\0';
  }
  return buf;
}

Assistant:

char *pstrcat(char *buf, int buf_size, const char *s)
{
    int len;
    len = strlen(buf);
    if (len < buf_size)
        pstrcpy(buf + len, buf_size - len, s);
    return buf;
}